

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-list.c
# Opt level: O1

void monster_list_show_interactive(wchar_t height,wchar_t width)

{
  region orig_area;
  bool bVar1;
  textblock *tb;
  monster_list_t *list;
  code *compare;
  char *src;
  keypress kVar2;
  region_conflict r;
  size_t max_height;
  size_t max_width;
  char buf [300];
  region local_188;
  size_t local_178;
  size_t local_170;
  char local_168 [312];
  
  bVar1 = false;
  local_170 = 0;
  local_178 = 0;
  if (L'\0' < width && L'\0' < height) {
    do {
      tb = textblock_new();
      list = monster_list_new();
      monster_list_collect(list);
      monster_list_get_glyphs(list);
      compare = monster_list_compare_exp;
      if (!bVar1) {
        compare = monster_list_standard_compare;
      }
      src = "Press \'x\' to turn OFF \'sort by exp\'";
      if (!bVar1) {
        src = "Press \'x\' to turn ON \'sort by exp\'";
      }
      monster_list_sort(list,compare);
      monster_list_format_textblock(list,(textblock *)0x0,L'Ϩ',L'Ϩ',&local_178,&local_170);
      local_188.page_rows = (wchar_t)local_178 + L'\x03';
      if (height + L'\xfffffffd' < (wchar_t)local_178 + L'\x03') {
        local_188.page_rows = height + L'\xfffffffd';
      }
      local_188.width = (wchar_t)local_170;
      if (width + L'\xffffffd8' < (wchar_t)local_170) {
        local_188.width = width + L'\xffffffd8';
      }
      local_188.col = -local_188.width;
      local_188.row = L'\x01';
      monster_list_format_textblock
                (list,tb,(wchar_t)local_178,local_188.width,(size_t *)0x0,(size_t *)0x0);
      region_erase_bordered(&local_188);
      my_strcpy(local_168,src,300);
      orig_area.row = local_188.row;
      orig_area.col = local_188.col;
      orig_area.width = local_188.width;
      orig_area.page_rows = local_188.page_rows;
      kVar2 = textui_textblock_show(tb,orig_area,local_168);
      bVar1 = (bool)(bVar1 ^ 1);
      textblock_free(tb);
      monster_list_free(list);
    } while (kVar2.code == 0x78);
  }
  return;
}

Assistant:

void monster_list_show_interactive(int height, int width)
{
	textblock *tb;
	monster_list_t *list;
	size_t max_width = 0, max_height = 0;
	int safe_height, safe_width;
	region r;
	int sort_exp = 0;
	struct keypress ch;

	if (height < 1 || width < 1)
		return;

	// Repeat
	do {

		tb = textblock_new();
		list = monster_list_new();

		monster_list_collect(list);
		monster_list_get_glyphs(list);

		monster_list_sort(list, sort_exp ? monster_list_compare_exp : monster_list_standard_compare);

		/* Figure out optimal display rect. Large numbers are passed as the height
		 * and width limit so that we can calculate the maximum number of rows and
		 * columns to display the list nicely. We then adjust those values as
		 * needed to fit in the main term. Height is adjusted to account for the
		 * texblock prompt. The list is positioned on the right side of the term
		 * underneath the status line.
		 */
		monster_list_format_textblock(list, NULL, 1000, 1000, &max_height,
									  &max_width);
		safe_height = MIN(height - 3, (int) max_height + 3);
		safe_width = MIN(width - 40, (int) max_width);
		r.col = -safe_width;
		r.row = 1;
		r.width = safe_width;
		r.page_rows = safe_height;

		/*
		 * Actually draw the list. We pass in max_height to the format function so
		 * that all lines will be appended to the textblock. The textblock itself
		 * will handle fitting it into the region. However, we have to pass
		 * safe_width so that the format function will pad the lines properly so
		 * that the location string is aligned to the right edge of the list.
		 */
		monster_list_format_textblock(list, tb, (int) max_height, safe_width, NULL,
									  NULL);
		region_erase_bordered(&r);

		char buf[300];

		if (sort_exp) {
			my_strcpy(buf, "Press 'x' to turn OFF 'sort by exp'", sizeof(buf));
		}
		else {
			my_strcpy(buf, "Press 'x' to turn ON 'sort by exp'", sizeof(buf));
		}

		ch = textui_textblock_show(tb, r, buf);

		// Toggle sort
		sort_exp = !sort_exp;

		textblock_free(tb);
		monster_list_free(list);
	}
	while (ch.code == 'x');
}